

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

Allocation __thiscall
density::
heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
::inplace_allocate<1ul,true,256ul,128ul>
          (heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
           *this)

{
  bool bVar1;
  void *pvVar2;
  void *pvVar3;
  void *end_of_page;
  void *new_element;
  void *new_tail;
  ControlBlock *control_block;
  bool over_aligned;
  bool can_fit_in_a_page;
  size_t size;
  size_t alignment;
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  void *local_10;
  
  bVar1 = address_is_aligned(*(void **)(this + 0x30),8);
  if ((!bVar1) && (*(long *)(this + 0x30) != 0xef)) {
    density_tests::detail::assert_failed<>
              ("address_is_aligned(m_tail, min_alignment) || m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block)"
               ,anon_var_dwarf_12e55,0xac8);
  }
  this_local = *(heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                 **)(this + 0x30);
  pvVar2 = address_add(this_local,0x10);
  local_10 = address_upper_align(pvVar2,0x80);
  bVar1 = address_is_aligned(local_10,8);
  if ((!bVar1) && (*(long *)(this + 0x30) != 0xef)) {
    density_tests::detail::assert_failed<>
              ("address_is_aligned(new_tail, min_alignment) || m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block)"
               ,anon_var_dwarf_12e55,0xae0);
  }
  pvVar2 = address_add(local_10,0x100);
  pvVar3 = heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
           ::get_end_of_page(this_local);
  if (pvVar3 < pvVar2) {
    _this_local = external_allocate<1ul>(this,0x100,0x80);
  }
  else {
    memset(this_local,0,8);
    ((ControlBlock *)this_local)->m_next = (long)pvVar2 + 1;
    *(void **)(this + 0x30) = pvVar2;
  }
  return _this_local;
}

Assistant:

Allocation inplace_allocate()
        {
            static_assert(is_power_of_2(ALIGNMENT) && (SIZE % ALIGNMENT) == 0, "");

            DENSITY_ASSERT_INTERNAL(
              address_is_aligned(m_tail, min_alignment) ||
              m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block));

            constexpr size_t alignment = detail::size_max(ALIGNMENT, min_alignment);
            constexpr size_t size      = uint_upper_align(SIZE, alignment);
            constexpr bool   can_fit_in_a_page =
              size + (alignment - min_alignment) <= s_max_size_inpage;
            constexpr bool over_aligned = alignment > min_alignment;

            for (;;)
            {
                // allocate space for the control block and the runtime type
                auto const control_block = m_tail;
                void *     new_tail      = address_add(
                  control_block,
                  INCLUDE_TYPE ? (s_sizeof_ControlBlock + s_sizeof_RuntimeType)
                               : s_sizeof_ControlBlock);

                // allocate space for the element
                if (over_aligned)
                {
                    new_tail = address_upper_align(new_tail, alignment);
                }
                DENSITY_ASSERT_INTERNAL(
                  address_is_aligned(new_tail, min_alignment) ||
                  m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block));
                void * new_element = new_tail;
                new_tail           = address_add(new_tail, size);

                // check if a page overflow would occur
                void * end_of_page = get_end_of_page(control_block);
                if (DENSITY_LIKELY(new_tail <= end_of_page))
                {
                    DENSITY_ASSUME(control_block != nullptr);
                    new (control_block) ControlBlock();

                    control_block->m_next = reinterpret_cast<uintptr_t>(new_tail) + CONTROL_BITS;
                    m_tail                = static_cast<ControlBlock *>(new_tail);
                    return Allocation{control_block, new_element};
                }
                else if (can_fit_in_a_page)
                {
                    // allocate a new page and redo
                    allocate_new_page();
                }
                else
                {
                    // this allocation would never fit in a page, allocate an external block
                    return external_allocate<CONTROL_BITS>(size, alignment);
                }
            }
        }